

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sfmNtk.c
# Opt level: O2

void Sfm_CheckConsistency(Vec_Wec_t *vFanins,int nPis,int nPos,Vec_Str_t *vFixed)

{
  uint __line;
  char cVar1;
  int iVar2;
  Vec_Int_t *p;
  int i;
  char *__assertion;
  int i_00;
  
  i_00 = 0;
  do {
    if (vFanins->nSize <= i_00) {
      return;
    }
    p = Vec_WecEntry(vFanins,i_00);
    if (i_00 < nPis) {
      if (p->nSize == 0) {
        cVar1 = Vec_StrEntry(vFixed,i_00);
        if (cVar1 == '\0') goto LAB_0045120a;
      }
      __assertion = "Vec_IntSize(vArray) == 0 && Vec_StrEntry(vFixed, i) == (char)0";
      __line = 0x36;
      goto LAB_00451275;
    }
LAB_0045120a:
    i = 0;
    while (i < p->nSize) {
      iVar2 = Vec_IntEntry(p,i);
      i = i + 1;
      if (vFanins->nSize <= iVar2 + nPos) {
        __assertion = "Fanin + nPos < Vec_WecSize(vFanins)";
        __line = 0x3a;
        goto LAB_00451275;
      }
    }
    if (vFanins->nSize <= i_00 + nPos) {
      if (p->nSize == 1) {
        cVar1 = Vec_StrEntry(vFixed,i_00);
        if (cVar1 == '\0') goto LAB_0045124a;
      }
      __assertion = "Vec_IntSize(vArray) == 1 && Vec_StrEntry(vFixed, i) == (char)0";
      __line = 0x3d;
LAB_00451275:
      __assert_fail(__assertion,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/sfm/sfmNtk.c"
                    ,__line,"void Sfm_CheckConsistency(Vec_Wec_t *, int, int, Vec_Str_t *)");
    }
LAB_0045124a:
    i_00 = i_00 + 1;
  } while( true );
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    []

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
void Sfm_CheckConsistency( Vec_Wec_t * vFanins, int nPis, int nPos, Vec_Str_t * vFixed )
{
    Vec_Int_t * vArray;
    int i, k, Fanin;
    // check entries
    Vec_WecForEachLevel( vFanins, vArray, i )
    {
        // PIs have no fanins
        if ( i < nPis )
            assert( Vec_IntSize(vArray) == 0 && Vec_StrEntry(vFixed, i) == (char)0 );
        // nodes are in a topo order; POs cannot be fanins
        Vec_IntForEachEntry( vArray, Fanin, k )
//            assert( Fanin < i && Fanin + nPos < Vec_WecSize(vFanins) );
            assert( Fanin + nPos < Vec_WecSize(vFanins) );
        // POs have one fanout
        if ( i + nPos >= Vec_WecSize(vFanins) )
            assert( Vec_IntSize(vArray) == 1 && Vec_StrEntry(vFixed, i) == (char)0 );
    }
}